

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tile.cc
# Opt level: O3

void __thiscall
brown::Tile::print6x8(Tile *this,int ox,int y,uint32_t fcol,uint32_t bcol,char *fmt,...)

{
  bool bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  char in_AL;
  int iVar5;
  long lVar6;
  char cVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  uint32_t uVar11;
  uint uVar12;
  uint uVar13;
  char *pcVar14;
  uint uVar15;
  long lVar16;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined4 in_XMM3_Da;
  undefined8 in_XMM4_Qa;
  int iVar18;
  undefined1 auVar17 [16];
  undefined8 in_XMM5_Qa;
  undefined1 auVar19 [16];
  undefined8 in_XMM6_Qa;
  int iVar21;
  undefined1 auVar20 [16];
  undefined8 in_XMM7_Qa;
  va_list arglist;
  char st [1024];
  undefined8 local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  undefined1 local_4e8 [48];
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined4 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  char local_438;
  char local_437 [1022];
  undefined1 local_39;
  
  if (in_AL != '\0') {
    local_4b8 = in_XMM0_Qa;
    local_4a8 = in_XMM1_Qa;
    local_498 = in_XMM2_Qa;
    local_488 = in_XMM3_Da;
    local_478 = in_XMM4_Qa;
    local_468 = in_XMM5_Qa;
    local_458 = in_XMM6_Qa;
    local_448 = in_XMM7_Qa;
  }
  if (fmt != (char *)0x0) {
    local_4f8 = local_4e8;
    local_500 = &stack0x00000008;
    local_508 = 0x3000000030;
    iVar5 = vsnprintf(&local_438,0x3ff,fmt,&local_508);
    auVar4 = _DAT_001081a0;
    auVar3 = _DAT_00108190;
    auVar2 = _DAT_00108180;
    if (iVar5 != 0) {
      local_39 = 0;
    }
    iVar5 = this->p;
    lVar6 = (long)(iVar5 * y) + this->f;
    uVar12 = 1;
    do {
      if ((uint)y < (uint)this->y && local_438 != '\0') {
        pcVar14 = &local_438;
        cVar7 = local_438;
        iVar5 = ox;
        do {
          uVar15 = -iVar5;
          uVar8 = 0;
          if (iVar5 < 0) {
            uVar8 = uVar15;
          }
          uVar13 = this->x - iVar5;
          if (5 < (int)uVar13) {
            uVar13 = 6;
          }
          if ((int)uVar8 < (int)uVar13) {
            uVar10 = (ulong)uVar8;
            lVar16 = 0;
            do {
              uVar11 = fcol;
              if ((uVar12 & (int)(char)font6x8[lVar16 + uVar10 + (long)cVar7 * 6]) == 0) {
                uVar11 = bcol;
              }
              *(uint32_t *)(uVar10 * 4 + (long)iVar5 * 4 + lVar6 + lVar16 * 4) = uVar11;
              lVar16 = lVar16 + 1;
            } while (uVar13 - uVar10 != lVar16);
          }
          if (cVar7 == '\t') {
            if ((int)uVar15 < 7) {
              uVar15 = 6;
            }
            uVar8 = this->x - iVar5;
            if (0x11 < (int)uVar8) {
              uVar8 = 0x12;
            }
            if ((int)uVar15 < (int)uVar8) {
              lVar16 = (ulong)uVar8 - (ulong)uVar15;
              lVar9 = lVar16 + -1;
              auVar17._8_4_ = (int)lVar9;
              auVar17._0_8_ = lVar9;
              auVar17._12_4_ = (int)((ulong)lVar9 >> 0x20);
              lVar9 = (ulong)uVar15 * 4 + (long)iVar5 * 4 + lVar6 + 0xc;
              auVar17 = auVar17 ^ auVar4;
              uVar10 = 0;
              do {
                auVar19._8_4_ = (int)uVar10;
                auVar19._0_8_ = uVar10;
                auVar19._12_4_ = (int)(uVar10 >> 0x20);
                auVar20 = (auVar19 | auVar3) ^ auVar4;
                iVar18 = auVar17._4_4_;
                if ((bool)(~(iVar18 < auVar20._4_4_ ||
                            auVar17._0_4_ < auVar20._0_4_ && auVar20._4_4_ == iVar18) & 1)) {
                  *(uint32_t *)(lVar9 + -0xc + uVar10 * 4) = bcol;
                }
                if (auVar20._12_4_ <= auVar17._12_4_ &&
                    (auVar20._8_4_ <= auVar17._8_4_ || auVar20._12_4_ != auVar17._12_4_)) {
                  *(uint32_t *)(lVar9 + -8 + uVar10 * 4) = bcol;
                }
                auVar19 = (auVar19 | auVar2) ^ auVar4;
                iVar21 = auVar19._4_4_;
                if (iVar21 <= iVar18 && (iVar21 != iVar18 || auVar19._0_4_ <= auVar17._0_4_)) {
                  *(uint32_t *)(lVar9 + -4 + uVar10 * 4) = bcol;
                  *(uint32_t *)(lVar9 + uVar10 * 4) = bcol;
                }
                uVar10 = uVar10 + 4;
              } while ((lVar16 + 3U & 0xfffffffffffffffc) != uVar10);
            }
            iVar5 = iVar5 + 0xc;
          }
          iVar5 = iVar5 + 6;
          cVar7 = pcVar14[1];
          pcVar14 = pcVar14 + 1;
        } while (cVar7 != '\0');
        iVar5 = this->p;
      }
      y = y + 1;
      lVar6 = lVar6 + iVar5;
      bVar1 = (int)uVar12 < 0x80;
      uVar12 = uVar12 * 2;
    } while (bVar1);
  }
  return;
}

Assistant:

void Tile::print6x8 (int ox, int y, std::uint32_t fcol, std::uint32_t bcol, const char *fmt, ...)
{
    std::va_list arglist;
    char st[1024], *c, *v;
    int i, j, ie, x;
    std::uint32_t *lp, *lpx;

    if (!fmt) return;
    va_start(arglist,fmt);
    if (vsnprintf((char *)&st,sizeof(st)-1,fmt,arglist)) st[sizeof(st)-1] = 0;
    va_end(arglist);

    lp = (std::uint32_t *)(y*this->p+this->f);
    for(j=1;j<256;y++,lp=(std::uint32_t *)(((intptr_t)lp)+this->p),j+=j)
        if ((unsigned)y < (unsigned)this->y)
            for(c=st,x=ox;*c;c++,x+=6)
            {
                v = ((int)(*c))*6 + ((char *)font6x8); lpx = &lp[x];
                for(i=max(-x,0),ie=min(this->x-x,6);i<ie;i++) { if (v[i]&j) lpx[i] = fcol; else if (bcol >= 0) lpx[i] = bcol; }
                if ((*c) == 9) { if (bcol >= 0) { for(i=max(-x,6),ie=min(this->x-x,18);i<ie;i++) lpx[i] = bcol; } x += 2*6; }
            }
}